

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts_engine.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,"%s\n",
          "The HMM-Based Speech Synthesis Engine \"hts_engine API\"\nVersion 1.10 (http://hts-engine.sourceforge.net/)\nCopyright (C) 2001-2015 Nagoya Institute of Technology\n              2001-2008 Tokyo Institute of Technology\nAll rights reserved.\n"
         );
  fprintf(_stderr,"hts_engine - The HMM-based speech synthesis engine \"hts_engine API\"\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"  usage:\n");
  fprintf(_stderr,"    hts_engine [ options ] [ infile ]\n");
  fprintf(_stderr,
          "  options:                                                                   [  def][ min-- max]\n"
         );
  fprintf(_stderr,
          "    -m  htsvoice   : HTS voice files                                         [  N/A]\n");
  fprintf(_stderr,
          "    -od s          : filename of output label with duration                  [  N/A]\n");
  fprintf(_stderr,
          "    -om s          : filename of output spectrum                             [  N/A]\n");
  fprintf(_stderr,
          "    -of s          : filename of output log F0                               [  N/A]\n");
  fprintf(_stderr,
          "    -ol s          : filename of output low-pass filter                      [  N/A]\n");
  fprintf(_stderr,
          "    -or s          : filename of output raw audio (generated speech)         [  N/A]\n");
  fprintf(_stderr,
          "    -ow s          : filename of output wav audio (generated speech)         [  N/A]\n");
  fprintf(_stderr,
          "    -ot s          : filename of output trace information                    [  N/A]\n");
  fprintf(_stderr,
          "    -vp            : use phoneme alignment for duration                      [  N/A]\n");
  fprintf(_stderr,
          "    -i  i f1 .. fi : enable interpolation & specify number(i),coefficient(f) [  N/A]\n");
  fprintf(_stderr,
          "    -s  i          : sampling frequency                                      [ auto][   1--    ]\n"
         );
  fprintf(_stderr,
          "    -p  i          : frame period (point)                                    [ auto][   1--    ]\n"
         );
  fprintf(_stderr,
          "    -a  f          : all-pass constant                                       [ auto][ 0.0-- 1.0]\n"
         );
  fprintf(_stderr,
          "    -b  f          : postfiltering coefficient                               [  0.0][ 0.0-- 1.0]\n"
         );
  fprintf(_stderr,
          "    -r  f          : speech speed rate                                       [  1.0][ 0.0--    ]\n"
         );
  fprintf(_stderr,
          "    -fm f          : additional half-tone                                    [  0.0][    --    ]\n"
         );
  fprintf(_stderr,
          "    -u  f          : voiced/unvoiced threshold                               [  0.5][ 0.0-- 1.0]\n"
         );
  fprintf(_stderr,
          "    -jm f          : weight of GV for spectrum                               [  1.0][ 0.0--    ]\n"
         );
  fprintf(_stderr,
          "    -jf f          : weight of GV for log F0                                 [  1.0][ 0.0--    ]\n"
         );
  fprintf(_stderr,
          "    -g  f          : volume (dB)                                             [  0.0][    --    ]\n"
         );
  fprintf(_stderr,
          "    -z  i          : audio buffer size (if i==0, turn off)                   [    0][   0--    ]\n"
         );
  fprintf(_stderr,"  infile:\n");
  fprintf(_stderr,"    label file\n");
  fprintf(_stderr,"  note:\n");
  fprintf(_stderr,"    generated spectrum, log F0, and low-pass filter coefficient\n");
  fprintf(_stderr,"    sequences are saved in natural endian, binary (float) format.\n");
  fprintf(_stderr,"\n");
  exit(0);
}

Assistant:

void usage(void)
{
   fprintf(stderr, "%s\n", HTS_COPYRIGHT);
   fprintf(stderr, "hts_engine - The HMM-based speech synthesis engine \"hts_engine API\"\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "  usage:\n");
   fprintf(stderr, "    hts_engine [ options ] [ infile ]\n");
   fprintf(stderr, "  options:                                                                   [  def][ min-- max]\n");
   fprintf(stderr, "    -m  htsvoice   : HTS voice files                                         [  N/A]\n");
   fprintf(stderr, "    -od s          : filename of output label with duration                  [  N/A]\n");
   fprintf(stderr, "    -om s          : filename of output spectrum                             [  N/A]\n");
   fprintf(stderr, "    -of s          : filename of output log F0                               [  N/A]\n");
   fprintf(stderr, "    -ol s          : filename of output low-pass filter                      [  N/A]\n");
   fprintf(stderr, "    -or s          : filename of output raw audio (generated speech)         [  N/A]\n");
   fprintf(stderr, "    -ow s          : filename of output wav audio (generated speech)         [  N/A]\n");
   fprintf(stderr, "    -ot s          : filename of output trace information                    [  N/A]\n");
   fprintf(stderr, "    -vp            : use phoneme alignment for duration                      [  N/A]\n");
   fprintf(stderr, "    -i  i f1 .. fi : enable interpolation & specify number(i),coefficient(f) [  N/A]\n");
   fprintf(stderr, "    -s  i          : sampling frequency                                      [ auto][   1--    ]\n");
   fprintf(stderr, "    -p  i          : frame period (point)                                    [ auto][   1--    ]\n");
   fprintf(stderr, "    -a  f          : all-pass constant                                       [ auto][ 0.0-- 1.0]\n");
   fprintf(stderr, "    -b  f          : postfiltering coefficient                               [  0.0][ 0.0-- 1.0]\n");
   fprintf(stderr, "    -r  f          : speech speed rate                                       [  1.0][ 0.0--    ]\n");
   fprintf(stderr, "    -fm f          : additional half-tone                                    [  0.0][    --    ]\n");
   fprintf(stderr, "    -u  f          : voiced/unvoiced threshold                               [  0.5][ 0.0-- 1.0]\n");
   fprintf(stderr, "    -jm f          : weight of GV for spectrum                               [  1.0][ 0.0--    ]\n");
   fprintf(stderr, "    -jf f          : weight of GV for log F0                                 [  1.0][ 0.0--    ]\n");
   fprintf(stderr, "    -g  f          : volume (dB)                                             [  0.0][    --    ]\n");
   fprintf(stderr, "    -z  i          : audio buffer size (if i==0, turn off)                   [    0][   0--    ]\n");
   fprintf(stderr, "  infile:\n");
   fprintf(stderr, "    label file\n");
   fprintf(stderr, "  note:\n");
   fprintf(stderr, "    generated spectrum, log F0, and low-pass filter coefficient\n");
   fprintf(stderr, "    sequences are saved in natural endian, binary (float) format.\n");
   fprintf(stderr, "\n");

   exit(0);
}